

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-ssl.c
# Opt level: O0

void lws_ssl_bind_passphrase(SSL_CTX *ssl_ctx,int is_client,lws_context_creation_info *info)

{
  code *cb;
  lws_context_creation_info *info_local;
  int is_client_local;
  SSL_CTX *ssl_ctx_local;
  
  if ((info->ssl_private_key_password != (char *)0x0) ||
     (info->client_ssl_private_key_password != (char *)0x0)) {
    SSL_CTX_set_default_passwd_cb_userdata((SSL_CTX *)ssl_ctx,info);
    cb = lws_context_init_ssl_pem_passwd_cb;
    if (is_client != 0) {
      cb = lws_context_init_ssl_pem_passwd_client_cb;
    }
    SSL_CTX_set_default_passwd_cb((SSL_CTX *)ssl_ctx,cb);
  }
  return;
}

Assistant:

void
lws_ssl_bind_passphrase(SSL_CTX *ssl_ctx, int is_client,
			const struct lws_context_creation_info *info)
{
	if (!info->ssl_private_key_password &&
	    !info->client_ssl_private_key_password)
		return;
	/*
	 * password provided, set ssl callback and user data
	 * for checking password which will be trigered during
	 * SSL_CTX_use_PrivateKey_file function
	 */
	SSL_CTX_set_default_passwd_cb_userdata(ssl_ctx, (void *)info);
	SSL_CTX_set_default_passwd_cb(ssl_ctx, is_client ?
				      lws_context_init_ssl_pem_passwd_client_cb:
				      lws_context_init_ssl_pem_passwd_cb);
}